

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.h
# Opt level: O1

string * __thiscall
warhawk::common::cookie::to_string_abi_cxx11_(string *__return_storage_ptr__,cookie *this)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  uint __len;
  ulong __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str_2;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  pcVar1 = (this->m_domain)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->m_domain)._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pcVar1 = (this->m_path)._M_dataplus._M_p;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (this->m_path)._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar2 = this->m_expires;
  __val = -uVar2;
  if (0 < (long)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = __val;
    uVar4 = 4;
    do {
      __len = uVar4;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0010ed29;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0010ed29;
      }
      if (uVar6 < 10000) goto LAB_0010ed29;
      bVar3 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar4 = __len + 4;
    } while (bVar3);
    __len = __len + 1;
  }
LAB_0010ed29:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((long)uVar2 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)((long)local_50[0] - ((long)uVar2 >> 0x3f)),__len,__val);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_68 = *plVar7;
    lStack_60 = plVar5[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar7;
    local_78 = (long *)*plVar5;
  }
  local_70 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(this->m_value)._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( ) const
  {
    std::string res = m_domain + "\t";
    res += m_include_sub ? "TRUE\t" : "FALSE\t";
    res += m_path + "\t";
    res += m_secure ? "TRUE\t" : "FALSE\t";
    res += std::to_string( m_expires ) + "\t";
    res += m_name + "\t";
    res += m_value;
    return res;
  }